

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O0

Instr * __thiscall
IRBuilder::BuildProfiledFieldLoad
          (IRBuilder *this,OpCode loadOp,RegOpnd *dstOpnd,SymOpnd *srcOpnd,CacheId inlineCacheIndex,
          bool *pUnprofiled)

{
  bool bVar1;
  JITTimeProfileInfo *this_00;
  FldInfo *pFVar2;
  ProfiledInstr *pPVar3;
  FldInfo *pFVar4;
  anon_union_2_4_ea848c7b_for_ValueType_13 *paVar5;
  JITTimeFunctionBody *this_01;
  char16 *pcVar6;
  char16 *pcVar7;
  wchar local_1a8 [4];
  char16 debugStringBuffer [42];
  char local_148 [8];
  char valueTypeStr [256];
  ValueType valueType;
  JitProfilingInstr *pJStack_40;
  Instr *instr;
  bool *pUnprofiled_local;
  CacheId inlineCacheIndex_local;
  SymOpnd *srcOpnd_local;
  RegOpnd *dstOpnd_local;
  OpCode loadOp_local;
  IRBuilder *this_local;
  
  pJStack_40 = (JitProfilingInstr *)0x0;
  bVar1 = Func::DoSimpleJitDynamicProfile(this->m_func);
  if (bVar1) {
    pJStack_40 = IR::JitProfilingInstr::New
                           (loadOp,&dstOpnd->super_Opnd,&srcOpnd->super_Opnd,this->m_func);
  }
  else {
    bVar1 = Func::HasProfileInfo(this->m_func);
    if (bVar1) {
      pJStack_40 = (JitProfilingInstr *)
                   IR::ProfiledInstr::New
                             (loadOp,&dstOpnd->super_Opnd,&srcOpnd->super_Opnd,this->m_func);
      this_00 = Func::GetReadOnlyProfileInfo(this->m_func);
      pFVar2 = JITTimeProfileInfo::GetFldInfo(this_00,inlineCacheIndex);
      pPVar3 = IR::Instr::AsProfiledInstr((Instr *)pJStack_40);
      pFVar4 = IR::ProfiledInstr::anon_union_8_4_88fdcd80::FldInfo
                         ((anon_union_8_4_88fdcd80 *)&(pPVar3->u).field_3);
      *pFVar4 = *pFVar2;
      pPVar3 = IR::Instr::AsProfiledInstr((Instr *)pJStack_40);
      pFVar2 = IR::ProfiledInstr::anon_union_8_4_88fdcd80::FldInfo
                         ((anon_union_8_4_88fdcd80 *)&(pPVar3->u).field_3);
      bVar1 = Js::FldInfo::WasLdFldProfiled(pFVar2);
      *pUnprofiled = (bool)((bVar1 ^ 0xffU) & 1);
      pPVar3 = IR::Instr::AsProfiledInstr((Instr *)pJStack_40);
      paVar5 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)
               IR::ProfiledInstr::anon_union_8_4_88fdcd80::FldInfo
                         ((anon_union_8_4_88fdcd80 *)&(pPVar3->u).field_3);
      valueTypeStr._254_2_ = paVar5->field_0;
      IR::Opnd::SetValueType(&dstOpnd->super_Opnd,(ValueType)valueTypeStr._254_2_);
      bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,DynamicProfilePhase);
      if (bVar1) {
        pPVar3 = IR::Instr::AsProfiledInstr((Instr *)pJStack_40);
        pFVar2 = IR::ProfiledInstr::anon_union_8_4_88fdcd80::FldInfo
                           ((anon_union_8_4_88fdcd80 *)&(pPVar3->u).field_3);
        valueTypeStr._252_2_ = (pFVar2->valueType).field_0;
        ValueType::ToString((ValueType *)(valueTypeStr + 0xfc),(char (*) [256])local_148);
        this_01 = Func::GetJITFunctionBody(this->m_func);
        pcVar6 = JITTimeFunctionBody::GetDisplayName(this_01);
        pcVar7 = Func::GetDebugNumberSet(this->m_func,(wchar (*) [42])local_1a8);
        Output::Print(L"TestTrace function %s (%s) ValueType = %i ",pcVar6,pcVar7,local_148);
        IR::Instr::DumpTestTrace((Instr *)pJStack_40);
      }
    }
  }
  return &pJStack_40->super_Instr;
}

Assistant:

IR::Instr *
IRBuilder::BuildProfiledFieldLoad(Js::OpCode loadOp, IR::RegOpnd *dstOpnd, IR::SymOpnd *srcOpnd, Js::CacheId inlineCacheIndex, bool *pUnprofiled)
{
    IR::Instr * instr = nullptr;

    // Prefer JitProfilingInstr if we're in simplejit
    if (m_func->DoSimpleJitDynamicProfile())
    {
        instr = IR::JitProfilingInstr::New(loadOp, dstOpnd, srcOpnd, m_func);
    }
    else if (this->m_func->HasProfileInfo())
    {
        instr = IR::ProfiledInstr::New(loadOp, dstOpnd, srcOpnd, m_func);
        instr->AsProfiledInstr()->u.FldInfo() = *(m_func->GetReadOnlyProfileInfo()->GetFldInfo(inlineCacheIndex));
        *pUnprofiled = !instr->AsProfiledInstr()->u.FldInfo().WasLdFldProfiled();
        dstOpnd->SetValueType(instr->AsProfiledInstr()->u.FldInfo().valueType);
#if ENABLE_DEBUG_CONFIG_OPTIONS
        if(Js::Configuration::Global.flags.TestTrace.IsEnabled(Js::DynamicProfilePhase))
        {
            const ValueType valueType(instr->AsProfiledInstr()->u.FldInfo().valueType);
            char valueTypeStr[VALUE_TYPE_MAX_STRING_SIZE];
            valueType.ToString(valueTypeStr);
            char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
            Output::Print(_u("TestTrace function %s (%s) ValueType = %i "), m_func->GetJITFunctionBody()->GetDisplayName(), m_func->GetDebugNumberSet(debugStringBuffer), valueTypeStr);
            instr->DumpTestTrace();
        }
#endif
    }

    return instr;
}